

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printDot(JSPrinter *this,Ref node)

{
  size_t sVar1;
  Ref *pRVar2;
  Ref local_20;
  Ref node_local;
  
  local_20.inst = node.inst;
  pRVar2 = Ref::operator[](&local_20,1);
  print(this,pRVar2->inst);
  maybeSpace(this,'.');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '.';
  pRVar2 = Ref::operator[](&local_20,2);
  if (pRVar2->inst->type == String) {
    emit(this,(pRVar2->inst->field_1).str.str._M_str);
    return;
  }
  __assert_fail("isString()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0xeb,"const char *cashew::Value::getCString()");
}

Assistant:

void printDot(Ref node) {
    print(node[1]);
    emit('.');
    emit(node[2]->getCString());
  }